

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerPosixPipeConnection.cxx
# Opt level: O3

ssize_t __thiscall
cmDebugger::cmDebuggerPipeClient_POSIX::read
          (cmDebuggerPipeClient_POSIX *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  int iVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  
  cVar1 = (**(code **)((long)(this->super_ReaderWriter).super_Reader + 0x10))();
  if (cVar1 != '\0') {
    sVar3 = ::read(this->rw_pipe,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    iVar2 = (int)sVar3;
    if (iVar2 != 0) goto LAB_004ad693;
    (**(code **)((long)(this->super_ReaderWriter).super_Reader + 0x18))(this);
  }
  iVar2 = 0;
LAB_004ad693:
  return (long)iVar2;
}

Assistant:

size_t cmDebuggerPipeClient_POSIX::read(void* buffer, size_t n)
{
  int count = 0;
  if (isOpen()) {
    count = static_cast<int>(::read(rw_pipe, buffer, n));
    if (count == 0) {
      close();
    }
  }

  return count;
}